

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE.h
# Opt level: O2

Permutazione * __thiscall
ADE<Permutazione>::esegui
          (Permutazione *__return_storage_ptr__,ADE<Permutazione> *this,unsigned_short nIndividui,
          unsigned_long_long tempoDisponibileMs,double theta,double Fmin,double Fmax,
          bool normalizzazione,uint s)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_short i;
  uint uVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  IndiciRandom *pIVar13;
  ulong uVar14;
  long lVar15;
  short sVar16;
  ulong uVar17;
  uint i_5;
  ulong uVar18;
  unsigned_short i_1;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  unsigned_short treIndici [3];
  ulong local_58;
  
  lVar5 = std::chrono::_V2::system_clock::now();
  this->seed = s;
  if (s != 0) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&genRand.gen,(ulong)s);
  }
  uVar18 = (ulong)nIndividui;
  uVar14 = (ulong)((uint)nIndividui * 8);
  puVar6 = (undefined8 *)operator_new__(uVar14);
  puVar7 = (undefined8 *)operator_new__((ulong)((uint)nIndividui * 8 + 8));
  (**this->_vptr_ADE)(this,puVar6,uVar18);
  (**this->_vptr_ADE)(this,puVar7,(ulong)(nIndividui + 1 & 0xffff));
  pvVar8 = operator_new__(uVar14);
  pvVar9 = operator_new__(uVar14);
  pvVar10 = operator_new__(uVar18);
  pvVar11 = operator_new__(uVar14);
  pvVar12 = operator_new__(uVar14);
  (*this->_vptr_ADE[1])(this,puVar6,(ulong)nIndividui);
  pIVar13 = (IndiciRandom *)operator_new(0x18);
  IndiciRandom::IndiciRandom(pIVar13,&genRand,nIndividui);
  this->indiciRandom = pIVar13;
  for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
    *(undefined8 *)((long)pvVar11 + uVar14 * 8) = 0x3fe0000000000000;
    *(undefined8 *)((long)pvVar12 + uVar14 * 8) = 0x3fe0000000000000;
  }
  std::chrono::_V2::system_clock::now();
  local_58 = 0;
  do {
    std::
    __sort<Permutazione**,__gnu_cxx::__ops::_Iter_comp_iter<ADE<Permutazione>::esegui(unsigned_short,unsigned_long_long,double,double,double,bool,unsigned_int)::_lambda(Permutazione*,Permutazione*)_1_>>
              (puVar6);
    lVar15 = std::chrono::_V2::system_clock::now();
    dVar22 = (double)(long)((lVar5 + tempoDisponibileMs * 1000000) - lVar15) / 1000000000.0;
    if (dVar22 <= 0.0) break;
    for (uVar14 = 0; uVar14 != uVar18; uVar14 = uVar14 + 1) {
      uVar4 = Random::randIntU(&genRand,0,nIndividui - 1);
      dVar21 = *(double *)((long)pvVar11 + (ulong)(uVar4 & 0xffff) * 8);
      do {
        dVar20 = Random::cauchy(&genRand,dVar21,0.1);
      } while (dVar20 < 0.0);
      if (Fmax <= dVar20) {
        dVar20 = Fmax;
      }
      *(double *)((long)pvVar8 + uVar14 * 8) = dVar20;
      uVar4 = Random::randIntU(&genRand,0,nIndividui - 1);
      dVar21 = *(double *)((long)pvVar12 + (ulong)(uVar4 & 0xffff) * 8);
      do {
        dVar20 = Random::cauchy(&genRand,dVar21,0.1);
      } while (dVar20 < 0.0);
      if (Fmax <= dVar20) {
        dVar20 = Fmax;
      }
      *(double *)((long)pvVar9 + uVar14 * 8) = dVar20;
    }
    for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
      IndiciRandom::generaIndici(this->indiciRandom,treIndici,3);
      (**(code **)(*(long *)puVar7[uVar14] + 0x10))((long *)puVar7[uVar14],puVar6[treIndici[0]]);
      Permutazione::differenza((Permutazione *)puVar7[uVar14],(Permutazione *)puVar6[treIndici[1]]);
      (**(code **)(*(long *)puVar7[uVar14] + 0x18))(*(undefined8 *)((long)pvVar9 + uVar14 * 8));
      (**(code **)(*(long *)puVar7[uVar14 + 1] + 0x10))((long *)puVar7[uVar14 + 1],*puVar6);
      Permutazione::differenza((Permutazione *)puVar7[uVar14 + 1],(Permutazione *)puVar6[uVar14]);
      (**(code **)(*(long *)puVar7[uVar14 + 1] + 0x18))(*(undefined8 *)((long)pvVar8 + uVar14 * 8));
      Permutazione::somma((Permutazione *)puVar7[uVar14],(Permutazione *)puVar7[uVar14 + 1]);
      Permutazione::somma((Permutazione *)puVar7[uVar14],(Permutazione *)puVar6[uVar14]);
    }
    (*this->_vptr_ADE[6])(this,*puVar7);
    (*this->_vptr_ADE[4])
              (theta,this,puVar6,puVar7,(ulong)(uint)nIndividui,(ulong)normalizzazione,pvVar10);
    dVar21 = 0.0;
    dVar24 = 0.0;
    dVar20 = 0.0;
    dVar23 = 0.0;
    sVar16 = 0;
    for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
      if (*(char *)((long)pvVar10 + uVar14) == '\x01') {
        dVar1 = *(double *)((long)pvVar8 + uVar14 * 8);
        dVar24 = dVar24 + dVar1;
        dVar21 = dVar21 + dVar1 * dVar1;
        dVar1 = *(double *)((long)pvVar9 + uVar14 * 8);
        dVar23 = dVar23 + dVar1;
        dVar20 = dVar20 + dVar1 * dVar1;
        sVar16 = sVar16 + 1;
      }
    }
    if (sVar16 != 0) {
      *(double *)((long)pvVar11 + (ulong)((uint)(ushort)local_58 * 8)) = dVar21 / dVar24;
      *(double *)((long)pvVar12 + (ulong)((uint)(ushort)local_58 * 8)) = dVar20 / dVar23;
      local_58 = (ulong)((ushort)local_58 + 1) % (ulong)(uint)nIndividui;
    }
  } while (0.0 < dVar22);
  uVar4 = 0xffffffff;
  uVar17 = 0;
  for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
    uVar2 = *(uint *)(puVar6[uVar14] + 0x14);
    bVar19 = uVar2 < uVar4;
    if (bVar19) {
      uVar4 = uVar2;
    }
    uVar3 = uVar14 & 0xffffffff;
    if (!bVar19) {
      uVar3 = uVar17;
    }
    uVar17 = uVar3;
  }
  (*this->_vptr_ADE[6])(this,puVar6[uVar17 & 0xffff]);
  Permutazione::Permutazione(__return_storage_ptr__,(Permutazione *)puVar6[uVar17 & 0xffff]);
  for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
    if ((long *)puVar6[uVar14] != (long *)0x0) {
      (**(code **)(*(long *)puVar6[uVar14] + 8))();
    }
    if ((long *)puVar7[uVar14] != (long *)0x0) {
      (**(code **)(*(long *)puVar7[uVar14] + 8))();
    }
  }
  if ((long *)puVar7[uVar18] != (long *)0x0) {
    (**(code **)(*(long *)puVar7[uVar18] + 8))();
  }
  operator_delete__(puVar6);
  operator_delete__(puVar7);
  operator_delete__(pvVar8);
  operator_delete__(pvVar9);
  operator_delete__(pvVar11);
  operator_delete__(pvVar12);
  operator_delete__(pvVar10);
  pIVar13 = this->indiciRandom;
  if (pIVar13 != (IndiciRandom *)0x0) {
    IndiciRandom::~IndiciRandom(pIVar13);
  }
  operator_delete(pIVar13,0x18);
  return __return_storage_ptr__;
}

Assistant:

T esegui(unsigned short nIndividui, unsigned long long tempoDisponibileMs, double theta, double Fmin, 
			double Fmax, bool normalizzazione, unsigned int s) {

			using orologio = std::chrono::system_clock;
			auto tempoFinale = orologio::now() + chrono::milliseconds(tempoDisponibileMs);
			using sec = std::chrono::duration<double>;

			seed = s;
			if(seed > 0) genRand.impostaSeed(seed);

			T** popolazione = new T * [nIndividui];
			T** popolazioneAlternativa = new T * [nIndividui + 1];

			creaPopolazione(popolazione, nIndividui);

			//L'ultimo elemento � di appoggio
			creaPopolazione(popolazioneAlternativa, nIndividui + 1);

			double* vettoreF1 = new double[nIndividui];
			double* vettoreF2 = new double[nIndividui];

			bool* vettoreSuccessi = new bool[nIndividui];

			unsigned short h = nIndividui;
			double* vettoreM1 = new double[h];
			double* vettoreM2 = new double[h];

			inizializzaPopolazione(popolazione, nIndividui, normalizzazione);

			//stampa(popolazione, nIndividui);

			indiciRandom = new IndiciRandom(&genRand, nIndividui);

			for (unsigned short i = 0; i < h; i++) {
				vettoreM1[i] = 0.5;
				vettoreM2[i] = 0.5;
			}

			unsigned short treIndici[3];

			unsigned int contatore = 0;
			sec tempoDisponibile = tempoFinale - orologio::now();

			unsigned short posizione = 0;


			while (true) {

				sort(popolazione, popolazione + nIndividui, [](T* p1, T* p2) -> bool {
					return p1->score < p2->score;
				});

				sec tempoRimasto = tempoFinale - orologio::now();
				auto count = tempoRimasto.count();
				if (count <= 0.)
					break;

				//cout << "Tempo rimasto: " << (unsigned int)count << " secondi \t\r";
				//stampa(popolazione, nIndividui);

				unsigned short indiceRandom;
				double valoreRandom;

				for (unsigned short i = 0; i < nIndividui; i++) {

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM1[indiceRandom], 0.1);
					} while (valoreRandom < 0);

					vettoreF1[i] = min(Fmax, valoreRandom);

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM2[indiceRandom], 0.1);
					} while (valoreRandom < 0);
	
					vettoreF2[i] = min(Fmax, valoreRandom);
				}

				for (unsigned short i = 0; i < nIndividui; i++) {
					indiciRandom->generaIndici(treIndici, 3);

					*popolazioneAlternativa[i] = *(popolazione[treIndici[0]]);
					popolazioneAlternativa[i]->differenza(popolazione[treIndici[1]]);
					popolazioneAlternativa[i]->prodotto(vettoreF2[i]);

					*popolazioneAlternativa[i + 1] = *(popolazione[0]);
					popolazioneAlternativa[i + 1]->differenza(popolazione[i]);
					popolazioneAlternativa[i + 1]->prodotto(vettoreF1[i]);

					popolazioneAlternativa[i]->somma(popolazioneAlternativa[i + 1]);
					popolazioneAlternativa[i]->somma(popolazione[i]);
				}

				ricercaLocale(popolazioneAlternativa[0]);

				selezionaPopolazione(popolazione, popolazioneAlternativa, nIndividui, theta, normalizzazione, vettoreSuccessi);

				double sQ1 = 0, s1 = 0, sQ2 = 0, s2 = 0;

				unsigned short contatore = 0;
				for (unsigned short i = 0; i < nIndividui; i++) {
					if (vettoreSuccessi[i]) {
						sQ1 += pow(vettoreF1[i], 2);
						s1 += vettoreF1[i];
						sQ2 += pow(vettoreF2[i], 2);
						s2 += vettoreF2[i];
						contatore++;
					}
				}

				if (contatore != 0) {
					double mediaP = sQ1 / s1;
					vettoreM1[posizione] = mediaP;

					mediaP = sQ2 / s2;
					vettoreM2[posizione] = mediaP;

					posizione = (posizione + 1) % h;
				}
				
			}

			//cout << endl << endl;

			//Troviamo l'individuo migliore
			unsigned int migliorPunteggioIniziale = UINT32_MAX;
			unsigned short migliore = 0;

			for (unsigned short i = 0; i < nIndividui; i++) {
				if (popolazione[i]->score < migliorPunteggioIniziale) {
					migliorPunteggioIniziale = popolazione[i]->score;
					migliore = i;
				}
			}

			ricercaLocale(popolazione[migliore]);

			//stampa(popolazione, nIndividui);

			T migliorIndividuo = *(popolazione[migliore]);

			for (unsigned int i = 0; i < nIndividui; i++) {
				delete popolazione[i];
				delete popolazioneAlternativa[i];
			}
			delete popolazioneAlternativa[nIndividui];

			delete[] popolazione;
			delete[] popolazioneAlternativa;

			delete[] vettoreF1;
			delete[] vettoreF2;
			delete[] vettoreM1;
			delete[] vettoreM2;
			delete[] vettoreSuccessi;

			delete indiciRandom;

			return migliorIndividuo;
		}